

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_env.hpp
# Opt level: O1

void __thiscall
iutest::iu_global_format_stringstream::iu_global_format_stringstream
          (iu_global_format_stringstream *this,string *str)

{
  undefined1 *this_00;
  
  this_00 = &(this->super_iu_stringstream).field_0x80;
  std::ios_base::ios_base((ios_base *)this_00);
  *(code **)&(this->super_iu_stringstream).field_0x80 = std::terminate;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x158 = 0;
  *(undefined2 *)&(this->super_iu_stringstream).field_0x160 = 0;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x168 = 0;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x170 = 0;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x178 = 0;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x180 = 0;
  std::__cxx11::stringstream::stringstream
            ((stringstream *)this,(string *)&PTR_construction_vtable_24__0012d7d0,(_Ios_Openmode)str
            );
  *(undefined8 *)&this->super_iu_stringstream = 0x12d768;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x80 = 0x12d7b8;
  *(undefined8 *)&(this->super_iu_stringstream).field_0x10 = 0x12d790;
  TestEnv::get_vars();
  std::ios::copyfmt((ios *)this_00);
  return;
}

Assistant:

explicit iu_global_format_stringstream(const ::std::string& str)
        : iu_stringstream(str)
    {
#if IUTEST_HAS_STRINGSTREAM || IUTEST_HAS_STRSTREAM
        TestEnv::global_ostream_copyfmt(*this);
#endif
    }